

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::detail::ResultBuilder::binary_assert<0,bool,bool>(ResultBuilder *this,bool *lhs,bool *rhs)

{
  bool bVar1;
  bool bVar2;
  ContextOptions *pCVar3;
  bool *in_R8;
  String SStack_38;
  
  bVar1 = *lhs;
  bVar2 = *rhs;
  (this->super_AssertData).m_failed = bVar1 != bVar2;
  if ((bVar1 == bVar2) && (pCVar3 = getContextOptions(), pCVar3->success != true)) {
    return;
  }
  stringifyBinaryExpr<bool,bool>(&SStack_38,(detail *)lhs,(bool *)0x1be8fa,rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }